

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

int __thiscall CSnapshot::Crc(CSnapshot *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar1 = this->m_NumItems;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  iVar6 = 0;
  for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    iVar2 = (&this[1].m_DataSize)[(long)(int)uVar1 + uVar8];
    iVar3 = GetItemSize(this,(int)uVar8);
    uVar4 = (long)iVar3 / 4 & 0xffffffff;
    if ((int)((long)iVar3 / 4) < 1) {
      uVar4 = 0;
    }
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar6 = iVar6 + *(int *)((long)&(this + 1)[(int)uVar1].m_NumItems + uVar5 * 4 + (long)iVar2);
    }
  }
  return iVar6;
}

Assistant:

int CSnapshot::Crc() const
{
	int Crc = 0;

	for(int i = 0; i < m_NumItems; i++)
	{
		const CSnapshotItem *pItem = GetItem(i);
		int Size = GetItemSize(i);

		for(int b = 0; b < Size/4; b++)
			Crc += pItem->Data()[b];
	}
	return Crc;
}